

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError
file2memory_range(char **bufp,size_t *size,FILE *file,curl_off_t starto,curl_off_t endo)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  CURLcode CVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ParameterError PVar8;
  ulong uVar9;
  undefined1 *mem;
  curl_off_t cVar10;
  long lVar11;
  dynbuf dyn;
  char buffer [4096];
  curl_off_t local_1088;
  dynbuf local_1058;
  undefined1 local_1038 [4104];
  
  if (file == (FILE *)0x0) {
    *size = 0;
    *bufp = (char *)0x0;
    return PARAM_OK;
  }
  if (starto == 0) {
    local_1088 = 0;
    cVar10 = 0;
  }
  else if (_stdin == file) {
    local_1088 = 0;
    cVar10 = starto;
  }
  else {
    bVar1 = false;
    iVar3 = fseeko64((FILE *)file,starto,0);
    if (iVar3 != 0) {
      PVar8 = PARAM_READ_ERROR;
      goto LAB_0011b068;
    }
    cVar10 = 0;
    local_1088 = starto;
  }
  curlx_dyn_init(&local_1058,0x400000000);
  uVar9 = endo;
  do {
    sVar5 = fread(local_1038,1,0x1000,(FILE *)file);
    iVar3 = ferror((FILE *)file);
    if (iVar3 == 0) {
      cVar2 = '\0';
      if (sVar5 != 0) {
        if (cVar10 == 0) {
          cVar10 = 0;
          mem = local_1038;
        }
        else {
          lVar11 = cVar10 - sVar5;
          if (cVar10 < (long)sVar5) {
            sVar5 = sVar5 - cVar10;
            mem = local_1038 + cVar10;
            local_1088 = local_1088 + cVar10;
            cVar10 = 0;
          }
          else {
            local_1088 = local_1088 + sVar5;
            sVar5 = 0;
            mem = local_1038;
            cVar10 = lVar11;
          }
        }
        if (sVar5 != 0) {
          sVar6 = (endo + 1) - local_1088;
          if ((long)(sVar5 + local_1088) <= endo) {
            sVar6 = sVar5;
          }
          CVar4 = curlx_dyn_addn(&local_1058,mem,sVar6);
          if (CVar4 == CURLE_OK) {
            local_1088 = local_1088 + sVar6;
            cVar2 = (endo < local_1088) * '\x02';
            uVar9 = uVar9 & 0xffffffff;
          }
          else {
            cVar2 = '\x01';
            uVar9 = 0xf;
          }
        }
      }
    }
    else {
      curlx_dyn_free(&local_1058);
      *size = 0;
      *bufp = (char *)0x0;
      cVar2 = '\x01';
      uVar9 = 0x15;
    }
    PVar8 = (ParameterError)uVar9;
    if (cVar2 != '\0') {
      if (cVar2 != '\x02') {
        bVar1 = false;
        goto LAB_0011b068;
      }
      break;
    }
    iVar3 = feof((FILE *)file);
  } while (iVar3 == 0);
  sVar6 = curlx_dyn_len(&local_1058);
  *size = sVar6;
  pcVar7 = curlx_dyn_ptr(&local_1058);
  *bufp = pcVar7;
  bVar1 = true;
LAB_0011b068:
  if (bVar1) {
    return PARAM_OK;
  }
  return PVar8;
}

Assistant:

ParameterError file2memory_range(char **bufp, size_t *size, FILE *file,
                                 curl_off_t starto, curl_off_t endo)
{
  if(file) {
    size_t nread;
    struct curlx_dynbuf dyn;
    curl_off_t offset = 0;
    curl_off_t throwaway = 0;

    if(starto) {
      if(file != stdin) {
        if(myfseek(file, starto, SEEK_SET))
          return PARAM_READ_ERROR;
        offset = starto;
      }
      else
        /* we can't seek stdin, read 'starto' bytes and throw them away */
        throwaway = starto;
    }

    /* The size needs to fit in an int later */
    curlx_dyn_init(&dyn, MAX_FILE2MEMORY);
    do {
      char buffer[4096];
      size_t n_add;
      char *ptr_add;
      nread = fread(buffer, 1, sizeof(buffer), file);
      if(ferror(file)) {
        curlx_dyn_free(&dyn);
        *size = 0;
        *bufp = NULL;
        return PARAM_READ_ERROR;
      }
      n_add = nread;
      ptr_add = buffer;
      if(nread) {
        if(throwaway) {
          if(throwaway >= (curl_off_t)nread) {
            throwaway -= nread;
            offset += nread;
            n_add = 0; /* nothing to add */
          }
          else {
            /* append the trailing piece */
            n_add = (size_t)(nread - throwaway);
            ptr_add = &buffer[throwaway];
            offset += throwaway;
            throwaway = 0;
          }
        }
        if(n_add) {
          if((curl_off_t)(n_add + offset) > endo)
            n_add = (size_t)(endo - offset + 1);

          if(curlx_dyn_addn(&dyn, ptr_add, n_add))
            return PARAM_NO_MEM;

          offset += n_add;
          if(offset > endo)
            break;
        }
      }
    } while(!feof(file));
    *size = curlx_dyn_len(&dyn);
    *bufp = curlx_dyn_ptr(&dyn);
  }
  else {
    *size = 0;
    *bufp = NULL;
  }
  return PARAM_OK;
}